

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O1

void __thiscall Mems::save_mirrors_with_samples_2(Mems *this,string *input)

{
  Mems *pMVar1;
  ostream *poVar2;
  pointer pPVar3;
  pointer pMVar4;
  string local_248 [8];
  fstream f;
  ostream local_238 [512];
  Mems *local_38;
  
  std::fstream::fstream(local_248);
  std::fstream::open(local_248,(_Ios_Openmode)input);
  pMVar4 = (this->_mems_mirrors_randomrasterized).
           super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pMVar4 != (this->_mems_mirrors_randomrasterized).
                super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.super__Vector_impl_data.
                _M_finish) {
    local_38 = this;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_238,"id ",3);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_238,pMVar4->id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(local_238,"pos ",4);
      poVar2 = std::ostream::_M_insert<double>((pMVar4->_position).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>((pMVar4->_position).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>((pMVar4->_position).dis);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(local_238,"dis_sample ",0xb);
      poVar2 = std::ostream::_M_insert<double>((pMVar4->_displayed_sample).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>((pMVar4->_displayed_sample).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>((pMVar4->_displayed_sample).dis);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(local_238,"sample_ammount ",0xf);
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)local_238,pMVar4->_ammount_of_matching_samples);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      for (pPVar3 = (pMVar4->_matching_samples).
                    super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pPVar3 != (pMVar4->_matching_samples).
                    super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_finish; pPVar3 = pPVar3 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_238,"pos ",4);
        poVar2 = std::ostream::_M_insert<double>(pPVar3->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = std::ostream::_M_insert<double>(pPVar3->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = std::ostream::_M_insert<double>(pPVar3->dis);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_238,"--- ",4);
      pMVar1 = local_38;
      std::__ostream_insert<char,std::char_traits<char>>(local_238,";\n",2);
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != (pMVar1->_mems_mirrors_randomrasterized).
                       super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::fstream::close();
  std::fstream::~fstream(local_248);
  return;
}

Assistant:

void Mems::save_mirrors_with_samples_2(std::string input){
    std::fstream f;
    f.open(input, std::ios::out);
    for(auto mi = _mems_mirrors_randomrasterized.begin(); mi!= _mems_mirrors_randomrasterized.end(); ++mi){
        f << "id " << mi->id<< ";\n";
        f << "pos " << mi->_position.x<< " "<< mi->_position.y<< " "<< mi->_position.dis<< ";\n";
        f << "dis_sample " << mi->_displayed_sample.x<< " "<< mi->_displayed_sample.y<< " "<< mi->_displayed_sample.dis<< ";\n";
        f << "sample_ammount " << mi->_ammount_of_matching_samples<< ";\n";
        for(auto sam = mi->_matching_samples.begin(); sam!=mi->_matching_samples.end(); ++sam){
          f << "pos " <<sam->x<< " "<< sam->y<< " "<< sam->dis<< ";\n";
        }
        f << "--- " << ";\n";
      }
      f.close();
    }